

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-scan.c
# Opt level: O1

gboolean loudness_scan_parse(int *argc,char ***argv)

{
  gchar *__s1;
  gboolean gVar1;
  int iVar2;
  gboolean gVar3;
  
  gVar1 = parse_mode_args(argc,argv,entries);
  __s1 = peak;
  if ((((peak != (gchar *)0x0) && (iVar2 = strcmp(peak,"sample"), iVar2 != 0)) &&
      (iVar2 = strcmp(__s1,"true"), iVar2 != 0)) &&
     ((iVar2 = strcmp(__s1,"dbtp"), iVar2 != 0 && (iVar2 = strcmp(__s1,"all"), iVar2 != 0)))) {
    loudness_scan_parse_cold_1();
    return 0;
  }
  gVar3 = 1;
  if (gVar1 == 0) {
    gVar3 = 0;
    if (*argc == 1) {
      loudness_scan_parse_cold_2();
      gVar3 = 0;
    }
  }
  return gVar3;
}

Assistant:

gboolean
loudness_scan_parse(int *argc, char **argv[])
{
	gboolean success = parse_mode_args(argc, argv, entries);
	if (peak && strcmp(peak, "sample") && strcmp(peak, "true") &&
	    strcmp(peak, "dbtp") && strcmp(peak, "all")) {
		fprintf(stderr, "Invalid argument to --peak!\n");
		return FALSE;
	}
	if (!success) {
		if (*argc == 1)
			fprintf(stderr, "Missing arguments\n");
		return FALSE;
	}
	return TRUE;
}